

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSparsityPatternLearner.h
# Opt level: O3

void __thiscall chrono::ChSparsityPatternLearner::process(ChSparsityPatternLearner *this)

{
  uint *puVar1;
  pointer piVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  pointer plVar12;
  long lVar13;
  ulong uVar14;
  pointer this_00;
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar21 [64];
  undefined1 auVar20 [64];
  
  plVar12 = (this->innerVectors).
            super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this_00 = plVar12;
  if (plVar12 !=
      (this->innerVectors).
      super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__cxx11::list<int,_std::allocator<int>_>::sort(this_00);
      std::__cxx11::list<int,_std::allocator<int>_>::unique(this_00);
      this_00 = this_00 + 1;
    } while (this_00 !=
             (this->innerVectors).
             super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    plVar12 = (this->innerVectors).
              super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&this->innerVectors_size,((long)this_00 - (long)plVar12 >> 3) * -0x5555555555555555);
  plVar12 = (this->innerVectors).
            super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar13 = (long)(this->innerVectors).
                 super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)plVar12;
  if (lVar13 != 0) {
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar17 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar18 = vpbroadcastq_avx512f(ZEXT816(8));
    piVar2 = (this->innerVectors_size).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar13 = (lVar13 >> 3) * -0x5555555555555555;
    auVar19 = vpbroadcastq_avx512f();
    uVar14 = 0;
    do {
      vpmullq_avx512dq(auVar16,auVar17);
      uVar11 = vpcmpuq_avx512f(auVar16,auVar19,2);
      auVar16 = vpaddq_avx512f(auVar16,auVar18);
      auVar20 = vpgatherqq_avx512f(*(size_t *)
                                    ((long)&(plVar12->super__List_base<int,_std::allocator<int>_>).
                                            _M_impl._M_node + 0x10));
      auVar21._8_8_ = (ulong)((byte)(uVar11 >> 1) & 1) * auVar20._8_8_;
      auVar21._0_8_ = (ulong)((byte)uVar11 & 1) * auVar20._0_8_;
      auVar21._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * auVar20._16_8_;
      auVar21._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * auVar20._24_8_;
      auVar21._32_8_ = (ulong)((byte)(uVar11 >> 4) & 1) * auVar20._32_8_;
      auVar21._40_8_ = (ulong)((byte)(uVar11 >> 5) & 1) * auVar20._40_8_;
      auVar21._48_8_ = (ulong)((byte)(uVar11 >> 6) & 1) * auVar20._48_8_;
      auVar21._56_8_ = (uVar11 >> 7) * auVar20._56_8_;
      puVar1 = (uint *)(piVar2 + uVar14);
      auVar15 = vpmovqd_avx512f(auVar21);
      bVar3 = (bool)((byte)uVar11 & 1);
      bVar4 = (bool)((byte)(uVar11 >> 1) & 1);
      bVar5 = (bool)((byte)(uVar11 >> 2) & 1);
      bVar6 = (bool)((byte)(uVar11 >> 3) & 1);
      bVar7 = (bool)((byte)(uVar11 >> 4) & 1);
      bVar8 = (bool)((byte)(uVar11 >> 5) & 1);
      bVar9 = (bool)((byte)(uVar11 >> 6) & 1);
      bVar10 = SUB81(uVar11 >> 7,0);
      *puVar1 = (uint)bVar3 * auVar15._0_4_ | (uint)!bVar3 * *puVar1;
      puVar1[1] = (uint)bVar4 * auVar15._4_4_ | (uint)!bVar4 * puVar1[1];
      puVar1[2] = (uint)bVar5 * auVar15._8_4_ | (uint)!bVar5 * puVar1[2];
      puVar1[3] = (uint)bVar6 * auVar15._12_4_ | (uint)!bVar6 * puVar1[3];
      puVar1[4] = (uint)bVar7 * auVar15._16_4_ | (uint)!bVar7 * puVar1[4];
      puVar1[5] = (uint)bVar8 * auVar15._20_4_ | (uint)!bVar8 * puVar1[5];
      puVar1[6] = (uint)bVar9 * auVar15._24_4_ | (uint)!bVar9 * puVar1[6];
      puVar1[7] = (uint)bVar10 * auVar15._28_4_ | (uint)!bVar10 * puVar1[7];
      uVar14 = uVar14 + 8;
    } while ((lVar13 + (ulong)(lVar13 == 0) + 7 & 0xfffffffffffffff8) != uVar14);
  }
  this->processed = true;
  return;
}

Assistant:

void process() {
        // Find the unique indices of non-zero elements in each inner vector
        for (auto vec = innerVectors.begin(); vec != innerVectors.end(); ++vec) {
            vec->sort();
            vec->unique();
        }

        // Cache the number of non-zero elements in each inner vector
        // (in each row if RowMajor, in each column if ColMajor)
        innerVectors_size.resize(innerVectors.size());
        for (auto i = 0; i < innerVectors.size(); ++i) {
            innerVectors_size[i] = static_cast<int>(innerVectors[i].size());
        }

        processed = true;
    }